

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndFunctionCommand.h
# Opt level: O0

cmCommand * __thiscall cmEndFunctionCommand::Clone(cmEndFunctionCommand *this)

{
  cmCommand *this_00;
  cmEndFunctionCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmEndFunctionCommand((cmEndFunctionCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmEndFunctionCommand;
    }